

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relations.cpp
# Opt level: O1

Relations * __thiscall dg::vr::Relations::addImplied(Relations *this)

{
  ulong uVar1;
  
  uVar1 = (this->bits).super__Base_bitset<1UL>._M_w;
  if ((uVar1 & 1) != 0) {
    (this->bits).super__Base_bitset<1UL>._M_w = uVar1 | 0x154;
  }
  uVar1 = (this->bits).super__Base_bitset<1UL>._M_w;
  if ((uVar1 & 8) != 0) {
    (this->bits).super__Base_bitset<1UL>._M_w = uVar1 | 6;
  }
  uVar1 = (this->bits).super__Base_bitset<1UL>._M_w;
  if ((uVar1 & 0x20) != 0) {
    (this->bits).super__Base_bitset<1UL>._M_w = uVar1 | 0x12;
  }
  uVar1 = (this->bits).super__Base_bitset<1UL>._M_w;
  if ((char)uVar1 < '\0') {
    (this->bits).super__Base_bitset<1UL>._M_w = uVar1 | 0x42;
  }
  uVar1 = (this->bits).super__Base_bitset<1UL>._M_w;
  if (((uint)uVar1 >> 9 & 1) != 0) {
    (this->bits).super__Base_bitset<1UL>._M_w = uVar1 | 0x102;
  }
  return this;
}

Assistant:

Relations &Relations::addImplied() {
    if (has(EQ))
        sle().ule().sge().uge();
    if (has(SLT))
        sle().ne();
    if (has(ULT))
        ule().ne();
    if (has(SGT))
        sge().ne();
    if (has(UGT))
        uge().ne();
    return *this;
}